

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# green.c
# Opt level: O2

int green_future_done(green_future_t future)

{
  if (future == (green_future_t)0x0) {
    return 1;
  }
  if (0 < future->refs) {
    return (int)(future->state - green_future_aborted < 2);
  }
  fprintf(_stderr,"Assertion failed: \"%s\". at %s:%d\n","future->refs > 0",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/src/green.c"
          ,0x253);
  fflush(_stderr);
  abort();
}

Assistant:

int green_future_done(green_future_t future)
{
    if (future == NULL) {
        return GREEN_EINVAL;
    }
    green_assert(future->refs > 0);
    return (future->state == green_future_complete) ||
           (future->state == green_future_aborted);
}